

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-bitmap.h
# Opt level: O3

void bitmap_copy(bitmap_t dst,const_bitmap_t src)

{
  byte bVar1;
  bitmap_el_t *pbVar2;
  bitmap_el_t *pbVar3;
  ulong uVar4;
  bitmap_t pVVar5;
  bitmap_t pVVar6;
  MIR_context_t ctx;
  int iVar7;
  undefined8 extraout_RAX;
  bitmap_t pVVar8;
  bitmap_t pVVar9;
  bitmap_t pVVar10;
  char *pcVar11;
  ulong *extraout_RDX;
  const_bitmap_t extraout_RDX_00;
  const_bitmap_t extraout_RDX_01;
  char *pcVar12;
  bitmap_t pVVar13;
  bitmap_t unaff_RBP;
  bitmap_t pVVar14;
  const_bitmap_t nb;
  const_bitmap_t src_00;
  const_bitmap_t nb_00;
  const_bitmap_t nb_01;
  char *pcVar15;
  bitmap_t pVVar16;
  bitmap_el_t bVar17;
  size_t sVar18;
  bitmap_t unaff_R12;
  bitmap_t unaff_R13;
  ulong uVar19;
  const_bitmap_t pVVar20;
  long *plVar21;
  ulong uVar22;
  undefined8 uVar23;
  const_bitmap_t pVVar24;
  const_bitmap_t pVVar25;
  
  if (dst == (bitmap_t)0x0) {
    bitmap_copy_cold_3();
    pVVar9 = dst;
LAB_00165d50:
    bitmap_copy_cold_2();
  }
  else {
    pVVar9 = dst;
    if (src == (const_bitmap_t)0x0) goto LAB_00165d50;
    uVar22 = src->els_num;
    if (dst->els_num < uVar22) {
      bitmap_expand(dst,uVar22 << 6);
      pVVar9 = (bitmap_t)dst->varr;
LAB_00165d36:
      memcpy(pVVar9,src->varr,uVar22 << 3);
      return;
    }
    pVVar9 = (bitmap_t)dst->varr;
    if (pVVar9 != (bitmap_t)0x0) {
      dst->els_num = uVar22;
      goto LAB_00165d36;
    }
  }
  bitmap_copy_cold_1();
  if (src == (const_bitmap_t)0x0) {
    bitmap_and_cold_4();
    nb = src;
    pVVar10 = pVVar9;
LAB_00165e0e:
    bitmap_and_cold_3();
LAB_00165e13:
    bitmap_and_cold_2();
  }
  else {
    nb = src;
    pVVar10 = pVVar9;
    if (extraout_RDX == (ulong *)0x0) goto LAB_00165e0e;
    unaff_R13 = (bitmap_t)*extraout_RDX;
    unaff_R12 = (bitmap_t)src->els_num;
    unaff_RBP = unaff_R13;
    if (unaff_R13 < unaff_R12) {
      unaff_RBP = unaff_R12;
    }
    nb = (const_bitmap_t)((long)unaff_RBP << 6);
    bitmap_expand(pVVar9,(size_t)nb);
    if (pVVar9 == (bitmap_t)0x0) goto LAB_00165e13;
    pbVar2 = pVVar9->varr;
    if (unaff_RBP == (bitmap_t)0x0) {
      if (pbVar2 != (bitmap_el_t *)0x0) {
        pVVar8 = (bitmap_t)0x0;
        goto LAB_00165df7;
      }
    }
    else {
      pbVar3 = src->varr;
      nb = (const_bitmap_t)extraout_RDX[2];
      pVVar8 = (bitmap_t)0x0;
      pVVar13 = (bitmap_t)0x0;
      do {
        if (pVVar13 < unaff_R12) {
          bVar17 = pbVar3[(long)pVVar13];
        }
        else {
          bVar17 = 0;
        }
        if (pVVar13 < unaff_R13) {
          sVar18 = (&nb->els_num)[(long)pVVar13];
        }
        else {
          sVar18 = 0;
        }
        pVVar10 = (bitmap_t)((long)&pVVar13->els_num + 1);
        if ((sVar18 & bVar17) != 0) {
          pVVar8 = pVVar10;
        }
        pbVar2[(long)pVVar13] = sVar18 & bVar17;
        pVVar13 = pVVar10;
      } while (unaff_RBP != pVVar10);
      if (pVVar8 <= (bitmap_t)pVVar9->els_num) {
LAB_00165df7:
        pVVar9->els_num = (size_t)pVVar8;
        return;
      }
    }
  }
  bitmap_and_cold_1();
  pbVar2 = pVVar10[5].varr;
  if ((pbVar2 != (bitmap_el_t *)0x0) && (pbVar2[2] != 0)) {
    *pbVar2 = 0;
    return;
  }
  dom_con_func_0_cold_1();
  pVVar9 = (bitmap_t)pVVar10[3].size;
  bitmap_copy(pVVar9,(const_bitmap_t)nb[5].varr);
  plVar21 = (long *)nb[2].els_num;
  pVVar10 = (bitmap_t)nb[5].varr;
  src_00 = *(const_bitmap_t *)(*plVar21 + 0x90);
  bitmap_copy(pVVar10,src_00);
  while (plVar21 = (long *)plVar21[3], plVar21 != (long *)0x0) {
    src_00 = (const_bitmap_t)nb[5].varr;
    pVVar10 = src_00;
    bitmap_and(src_00,src_00,*(bitmap_t *)(*plVar21 + 0x90));
  }
  pVVar8 = (bitmap_t)nb[5].varr;
  if (pVVar8 == (bitmap_t)0x0) {
    dom_con_func_n_cold_2();
  }
  else if (pVVar9 != (bitmap_t)0x0) {
    uVar22 = pVVar8->els_num;
    uVar4 = pVVar9->els_num;
    pVVar10 = pVVar9;
    uVar19 = uVar4;
    if (uVar4 < uVar22) {
      pVVar10 = pVVar8;
      pVVar8 = pVVar9;
      uVar19 = uVar22;
      uVar22 = uVar4;
    }
    pbVar2 = pVVar10->varr;
    iVar7 = bcmp(pVVar8->varr,pbVar2,uVar22 * 8);
    if ((iVar7 == 0) && (uVar22 < uVar19)) {
      do {
        if (pbVar2[uVar22] != 0) {
          return;
        }
        uVar22 = uVar22 + 1;
      } while (uVar19 != uVar22);
    }
    return;
  }
  dom_con_func_n_cold_1();
  pVVar8 = (bitmap_t)pVVar10[3].size;
  if ((pVVar8 != (bitmap_t)0x0) && (pVVar8->varr != (bitmap_el_t *)0x0)) {
    pVVar8->els_num = 0;
    uVar22 = src_00->els_num;
    bitmap_expand(pVVar8,uVar22 + 1);
    pVVar8->varr[uVar22 >> 6] = pVVar8->varr[uVar22 >> 6] | 1L << (uVar22 & 0x3f);
    bitmap_ior((bitmap_t)src_00[6].els_num,(bitmap_t)src_00[5].varr,(bitmap_t)pVVar10[3].size);
    return;
  }
  dom_trans_func_cold_1();
  if (src_00 == (const_bitmap_t)0x0) {
    bitmap_ior_cold_4();
    nb_00 = src_00;
    pVVar13 = pVVar10;
LAB_00166050:
    bitmap_ior_cold_3();
LAB_00166055:
    bitmap_ior_cold_2();
    pVVar10 = pVVar9;
    src_00 = pVVar8;
  }
  else {
    nb_00 = src_00;
    pVVar13 = pVVar10;
    nb = extraout_RDX_00;
    if (extraout_RDX_00 == (const_bitmap_t)0x0) goto LAB_00166050;
    unaff_R13 = (bitmap_t)extraout_RDX_00->els_num;
    unaff_R12 = (bitmap_t)src_00->els_num;
    unaff_RBP = unaff_R13;
    if (unaff_R13 < unaff_R12) {
      unaff_RBP = unaff_R12;
    }
    nb_00 = (const_bitmap_t)((long)unaff_RBP << 6);
    bitmap_expand(pVVar10,(size_t)nb_00);
    pVVar9 = pVVar10;
    pVVar8 = src_00;
    if (pVVar10 == (bitmap_t)0x0) goto LAB_00166055;
    pbVar2 = pVVar10->varr;
    if (unaff_RBP == (bitmap_t)0x0) {
      if (pbVar2 != (bitmap_el_t *)0x0) {
        pVVar9 = (bitmap_t)0x0;
        goto LAB_00166039;
      }
    }
    else {
      nb_00 = (const_bitmap_t)src_00->varr;
      pVVar13 = (bitmap_t)extraout_RDX_00->varr;
      pVVar9 = (bitmap_t)0x0;
      pVVar8 = (bitmap_t)0x0;
      do {
        if (pVVar8 < unaff_R12) {
          sVar18 = (&nb_00->els_num)[(long)pVVar8];
        }
        else {
          sVar18 = 0;
        }
        if (pVVar8 < unaff_R13) {
          bVar17 = (&pVVar13->els_num)[(long)pVVar8];
        }
        else {
          bVar17 = 0;
        }
        nb = (const_bitmap_t)pbVar2[(long)pVVar8];
        pVVar5 = (bitmap_t)((long)&pVVar8->els_num + 1);
        if ((bVar17 | sVar18) != 0) {
          pVVar9 = pVVar5;
        }
        pbVar2[(long)pVVar8] = bVar17 | sVar18;
        pVVar8 = pVVar5;
      } while (unaff_RBP != pVVar5);
      if (pVVar9 <= (bitmap_t)pVVar10->els_num) {
LAB_00166039:
        pVVar10->els_num = (size_t)pVVar9;
        return;
      }
    }
  }
  bitmap_ior_cold_1();
  uVar23 = extraout_RAX;
  pVVar9 = pVVar10;
  pVVar25 = src_00;
  if (nb_00 == (const_bitmap_t)0x0) {
    pVVar24 = nb;
    bitmap_and_compl_cold_4();
    nb_01 = nb_00;
    pVVar8 = pVVar13;
    pVVar20 = nb;
    nb = pVVar24;
LAB_00166118:
    bitmap_and_compl_cold_3();
  }
  else {
    nb_01 = nb_00;
    pVVar8 = pVVar13;
    pVVar20 = extraout_RDX_01;
    if (extraout_RDX_01 == (const_bitmap_t)0x0) goto LAB_00166118;
    pVVar5 = (bitmap_t)extraout_RDX_01->els_num;
    pVVar6 = (bitmap_t)nb_00->els_num;
    pVVar14 = pVVar5;
    if (pVVar5 < pVVar6) {
      pVVar14 = pVVar6;
    }
    nb_01 = (const_bitmap_t)((long)pVVar14 << 6);
    bitmap_expand(pVVar13,(size_t)nb_01);
    pVVar10 = pVVar13;
    pVVar20 = extraout_RDX_01;
    src_00 = nb_00;
    if (pVVar13 != (bitmap_t)0x0) {
      pbVar2 = pVVar13->varr;
      if (pVVar14 == (bitmap_t)0x0) {
        if (pbVar2 != (bitmap_el_t *)0x0) {
          pVVar10 = (bitmap_t)0x0;
          goto LAB_00166101;
        }
      }
      else {
        pbVar3 = nb_00->varr;
        nb_01 = (const_bitmap_t)extraout_RDX_01->varr;
        pVVar10 = (bitmap_t)0x0;
        pVVar16 = (bitmap_t)0x0;
        do {
          if (pVVar16 < pVVar6) {
            bVar17 = pbVar3[(long)pVVar16];
          }
          else {
            bVar17 = 0;
          }
          uVar22 = 0xffffffffffffffff;
          if (pVVar16 < pVVar5) {
            uVar22 = ~(&nb_01->els_num)[(long)pVVar16];
          }
          pVVar8 = (bitmap_t)((long)&pVVar16->els_num + 1);
          if ((uVar22 & bVar17) != 0) {
            pVVar10 = pVVar8;
          }
          pbVar2[(long)pVVar16] = uVar22 & bVar17;
          pVVar16 = pVVar8;
        } while (pVVar14 != pVVar8);
        if (pVVar10 <= (bitmap_t)pVVar13->els_num) {
LAB_00166101:
          pVVar13->els_num = (size_t)pVVar10;
          return;
        }
      }
      goto LAB_00166122;
    }
  }
  bitmap_and_compl_cold_2();
  pVVar13 = pVVar10;
  nb_00 = src_00;
LAB_00166122:
  bitmap_and_compl_cold_1();
  if (((FILE *)pVVar8[1].els_num != (FILE *)0x0) && (1 < (int)pVVar8[1].size)) {
    bVar1 = *(byte *)((long)&nb_01->size + 1);
    pcVar15 = "may/must alloca ";
    ctx = (MIR_context_t)pVVar8->els_num;
    if ((bVar1 & 3) == 0) {
      pcVar15 = "must alloca";
    }
    pcVar11 = "const val";
    pcVar12 = "";
    if (bVar1 != 0) {
      pcVar12 = pcVar15;
    }
    if ((char)nb_01->size == '\0') {
      pcVar11 = "val";
    }
    fprintf((FILE *)pVVar8[1].els_num,"%s%s=%lld for insn %lu:",pcVar12,pcVar11,nb_01[1].els_num,
            (ulong)*(uint *)((long)&nb_01->size + 4),pVVar13,pVVar20,nb_00,uVar23,pVVar9,unaff_R12,
            unaff_R13,nb,pVVar25,unaff_RBP);
    MIR_output_insn(ctx,(FILE *)pVVar8[1].els_num,(MIR_insn_t_conflict)nb_01->els_num,
                    (MIR_func_t)pVVar8->varr[8],1);
    return;
  }
  return;
}

Assistant:

static inline void bitmap_copy (bitmap_t dst, const_bitmap_t src) {
  size_t dst_len = VARR_LENGTH (bitmap_el_t, dst);
  size_t src_len = VARR_LENGTH (bitmap_el_t, src);

  if (dst_len >= src_len)
    VARR_TRUNC (bitmap_el_t, dst, src_len);
  else
    bitmap_expand (dst, src_len * BITMAP_WORD_BITS);
  memcpy (VARR_ADDR (bitmap_el_t, dst), VARR_ADDR (bitmap_el_t, src),
          src_len * sizeof (bitmap_el_t));
}